

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minefield.cpp
# Opt level: O2

bool __thiscall Minefield::isMine(Minefield *this,int x,int y)

{
  bool bVar1;
  runtime_error *this_00;
  reference rVar2;
  
  checkPos(this,x,y);
  bVar1 = isGameRunning(this);
  if (bVar1) {
    bVar1 = isOpen(this,x,y);
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Can\'t check if is mine on not-opened field.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((this->mines).
                     super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + x,(long)y);
  return (*rVar2._M_p & rVar2._M_mask) != 0;
}

Assistant:

bool Minefield::isMine(int x, int y) {
    checkPos(x, y);
    if (isGameRunning() && ! isOpen(x, y)) {
        throw std::runtime_error("Can't check if is mine on not-opened field.");
    }

    return mines[x][y];
}